

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O0

rational<int> tcb::operator*(short *lhs,rational<short> *rhs)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  rational<short> *rhs_local;
  short *lhs_local;
  
  sVar1 = numerator<short,void>(*lhs);
  sVar2 = numerator<short>(rhs);
  sVar3 = denominator<short,void>(*lhs);
  sVar4 = denominator<short>(rhs);
  rational<int>::rational
            ((rational<int> *)&lhs_local,(int)sVar1 * (int)sVar2,(int)sVar3 * (int)sVar4);
  return (rational<int>)lhs_local;
}

Assistant:

constexpr auto
operator*(const T& lhs, const U& rhs)
{
    using value_type = decltype(std::declval<rational_value_t<T>>() *
            std::declval<rational_value_t<U>>());
    return rational<value_type>{
            numerator(lhs) * numerator(rhs),
            denominator(lhs) * denominator(rhs)};
}